

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Object * __thiscall ICM::Interpreter::run(Interpreter *this)

{
  undefined1 uVar1;
  Instruction IVar2;
  pointer ppIVar3;
  long *plVar4;
  long *plVar5;
  ElementPool *EP;
  TypeUnit TVar6;
  Element *pEVar7;
  element_type *ppOVar8;
  int iVar9;
  time_t tVar10;
  Object *pOVar11;
  InstructionData *pIVar12;
  undefined4 extraout_var;
  string *psVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar14;
  long lVar15;
  ulong uVar16;
  InstructionData *pIVar17;
  InstructionData *extraout_RDX;
  InstructionData *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  Element *e;
  Element *pEVar18;
  char *in_RSI;
  ulong uVar19;
  void *in_R8;
  Inc *inst;
  long lVar20;
  Object OVar21;
  lightlist_creater<ICM::Object_*> llc;
  DataList v;
  allocator_type local_81;
  undefined1 local_80 [32];
  DataList local_60;
  InstructionData local_48;
  long local_38;
  
  tVar10 = time((time_t *)0x0);
  srand((uint)tVar10);
  lVar20 = 0;
LAB_00127882:
  ppIVar3 = (this->InstList->
            super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ).
            super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar12 = ppIVar3[lVar20];
  IVar2 = pIVar12->Inst;
  iVar9 = 0x141b90;
  switch(IVar2) {
  case end:
    goto switchD_001278aa_caseD_1;
  case sing:
    pOVar11 = this->Result;
    goto LAB_00127de3;
  case stor:
    in_RSI = (char *)(pIVar12 + 1);
    pOVar11 = getObject(this,(Element *)in_RSI);
    goto LAB_00127de3;
  case list:
    pIVar17 = *(InstructionData **)((long)(pIVar12 + 1) + 8);
    local_80._0_8_ = (InstructionData *)pIVar12[1]._vptr_InstructionData;
    if (pIVar17 <= (InstructionData *)pIVar12[1]._vptr_InstructionData) {
      local_80._0_8_ = pIVar17;
    }
    local_80._8_8_ = pIVar17;
    createDataList(&local_60,this,
                   (RangeIterator<__gnu_cxx::__normal_iterator<ICM::Instruction::Element_*,_std::vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>_>_>
                    *)local_80);
    local_80._0_8_ = (InstructionData *)0x0;
    local_80._8_8_ = local_60._capacity;
    pIVar12 = (InstructionData *)malloc(local_60._capacity << 3);
    local_80._16_8_ = pIVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<ICM::Object**,void(*)(ICM::Object**),std::allocator<void>,void>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x18),pIVar12,
               Common::Memory::free<ICM::Object*>);
    ppOVar8 = local_60._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((Element *)local_60._capacity != (Element *)0x0) {
      lVar15 = local_60._capacity << 3;
      lVar14 = 0;
      __child_stack = extraout_RDX;
      do {
        iVar9 = Object::clone(*(Object **)((long)ppOVar8 + lVar14),(__fn *)pIVar12,__child_stack,
                              (int)pIVar17,in_R8);
        pIVar12 = (InstructionData *)
                  ((long)&((anon_union_4_2_4727c1b0_for_Element_0 *)local_80._0_8_)->type + 1);
        *(ulong *)(local_80._16_8_ + local_80._0_8_ * 8) = CONCAT44(extraout_var,iVar9);
        lVar14 = lVar14 + 8;
        pIVar17 = (InstructionData *)local_80._0_8_;
        __child_stack = (InstructionData *)local_80._16_8_;
        local_80._0_8_ = pIVar12;
      } while (lVar15 != lVar14);
    }
    pOVar11 = (Object *)operator_new(0x10);
    in_RSI = (char *)&local_48;
    std::vector<ICM::Object*,std::allocator<ICM::Object*>>::vector<ICM::Object*const*,void>
              ((vector<ICM::Object*,std::allocator<ICM::Object*>> *)in_RSI,
               (Object **)local_80._16_8_,(Object **)(local_80._16_8_ + local_80._8_8_ * 8),
               &local_81);
    Objects::DataObject<(ICM::DefaultType)17>::DataObject
              ((DataObject<(ICM::DefaultType)17> *)pOVar11,(T *)in_RSI);
    (this->TempResult).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar20] = pOVar11;
    if (local_48._vptr_InstructionData != (_func_int **)0x0) {
      in_RSI = (char *)(local_38 - (long)local_48._vptr_InstructionData);
      operator_delete(local_48._vptr_InstructionData,(ulong)in_RSI);
    }
    this->Result = (this->TempResult).
                   super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20];
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._24_8_);
    }
    if (local_60._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    break;
  case nop:
  case call:
  case iadd:
  case isub:
  case imul:
  case idiv:
  case imod:
  case ilrl:
  case farg:
  case fargl:
  case fargv:
  case fsub:
  case fsubr:
  case fsubv:
  case fcal:
  case set:
  case refs:
  case dec:
  case jmpc:
    break;
  case pti:
    pEVar7 = *(Element **)((long)(pIVar12 + 1) + 8);
    for (pEVar18 = (Element *)pIVar12[1]._vptr_InstructionData; pEVar18 != pEVar7;
        pEVar18 = pEVar18 + 1) {
      if (((pEVar18->field_0).field_0.etype == '\x03') &&
         ((pEVar18->field_0).field_0.stype == '\x04')) {
        psVar13 = getIdentName_abi_cxx11_(pEVar18);
        printf("%s",(psVar13->_M_dataplus)._M_p);
        putchar(0x28);
      }
      pOVar11 = getObject(this,pEVar18);
      if (pOVar11 == (Object *)0x0) {
        in_RSI = "Null";
        printf("%s");
      }
      else {
        pOVar11 = getObject(this,pEVar18);
        Object::to_string_abi_cxx11_((string *)local_80,pOVar11);
        in_RSI = (char *)local_80._0_8_;
        printf("%s");
        if ((InstructionData *)local_80._0_8_ != (InstructionData *)(local_80 + 0x10)) {
          in_RSI = (char *)(local_80._16_8_ + 1);
          operator_delete((void *)local_80._0_8_,(ulong)in_RSI);
        }
      }
      if (((pEVar18->field_0).field_0.etype == '\x03') &&
         ((pEVar18->field_0).field_0.stype == '\x04')) {
        putchar(0x29);
      }
      putchar(10);
    }
    break;
  case ccal:
    in_RSI = (char *)(pIVar12 + 1);
    pOVar11 = CheckCall(this,(vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>
                              *)in_RSI);
    goto LAB_00127de3;
  case let:
  case cpy:
  case ref:
    uVar1 = *(undefined1 *)((long)(pIVar12 + 1) + 8);
    if (uVar1 == sing) {
      uVar19 = (ulong)*(uint *)&pIVar12->field_0xc;
      uVar16 = (DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555;
      if (uVar16 < uVar19 || uVar16 - uVar19 == 0) goto LAB_00127f38;
      lVar14 = **(long **)(DAT_001537f8 + 0x10 + uVar19 * 0x18);
      lVar15 = (ulong)*(uint *)&pIVar12[1]._vptr_InstructionData * 0x20;
      if (*(int *)(lVar14 + lVar15) != 4) goto LAB_00127f65;
      in_RSI = (char *)(this->TempResult).
                       super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
      lVar14 = lVar14 + lVar15;
      lVar15 = *(long *)(lVar14 + 0x10);
      if ((lVar15 == 3) ||
         (lVar15 == **(long **)((anon_union_4_2_4727c1b0_for_Element_0 *)
                                &((InstructionData *)in_RSI)->_vptr_InstructionData +
                               (long)pIVar12[2]._vptr_InstructionData * 2))) {
        *(long **)(lVar14 + 0x18) =
             *(long **)((anon_union_4_2_4727c1b0_for_Element_0 *)
                        &((InstructionData *)in_RSI)->_vptr_InstructionData +
                       (long)pIVar12[2]._vptr_InstructionData * 2);
        break;
      }
LAB_00127ec8:
      in_RSI = "Error in set DyVarb for different type.";
    }
    else {
      pEVar18 = (Element *)((long)(pIVar12 + 1) + 8);
      if (uVar1 == end) {
        EP = this->EP;
        pOVar11 = (Object *)operator_new(0x10);
        OVar21 = getLiteral(pEVar18,EP);
        *pOVar11 = OVar21;
        in_RSI = (char *)(ulong)*(uint *)&pIVar12->field_0xc;
        pIVar17 = (InstructionData *)((DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555);
        if (pIVar17 < in_RSI || (long)pIVar17 - (long)in_RSI == 0) goto LAB_00127f38;
        lVar14 = **(long **)(DAT_001537f8 + 0x10 + (long)in_RSI * 0x18);
        lVar15 = (ulong)*(uint *)&pIVar12[1]._vptr_InstructionData * 0x20;
        if (*(int *)(lVar14 + lVar15) != 4) goto LAB_00127f65;
        lVar14 = lVar14 + lVar15;
        TVar6 = *(TypeUnit *)(lVar14 + 0x10);
        if ((TVar6 != 3) && (TVar6 != OVar21.type)) goto LAB_00127ec8;
        *(Object **)(lVar14 + 0x18) = pOVar11;
        break;
      }
      if ((uVar1 == stor) && (*(byte *)((long)(pIVar12 + 1) + 9) == 4)) {
        pOVar11 = getDyVarbData(pEVar18);
        if ((IVar2 != ref) && (IVar2 == cpy)) {
          iVar9 = Object::clone(pOVar11,(__fn *)in_RSI,__child_stack_01,iVar9,in_R8);
          pOVar11 = (Object *)CONCAT44(extraout_var_01,iVar9);
        }
LAB_00127e61:
        in_RSI = (char *)(ulong)*(uint *)&pIVar12->field_0xc;
        pIVar17 = (InstructionData *)((DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555);
        if (pIVar17 < in_RSI || (long)pIVar17 - (long)in_RSI == 0) {
LAB_00127f38:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        lVar14 = **(long **)(DAT_001537f8 + 0x10 + (long)in_RSI * 0x18);
        lVar15 = (ulong)*(uint *)&pIVar12[1]._vptr_InstructionData * 0x20;
        if (*(int *)(lVar14 + lVar15) != 4) {
LAB_00127f65:
          __assert_fail("getFromIdentTable(ident_index).type == I_DyVarb",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/temp-getelement2.h"
                        ,0x15,"void ICM::setDyVarbData(const IdentIndex &, Object *)");
        }
        lVar14 = lVar14 + lVar15;
        TVar6 = *(TypeUnit *)(lVar14 + 0x10);
        if ((TVar6 == 3) || (TVar6 == pOVar11->type)) {
          *(Object **)(lVar14 + 0x18) = pOVar11;
          break;
        }
        goto LAB_00127ec8;
      }
      if (uVar1 == stor) {
        pOVar11 = getIdentData(pEVar18);
        goto LAB_00127e61;
      }
      in_RSI = "Error in Assign.";
    }
    printf("%s");
    putchar(10);
    break;
  case cpys:
    in_RSI = (char *)(pIVar12 + 1);
    pOVar11 = getObject(this,(Element *)in_RSI);
    iVar9 = Object::clone(pOVar11,(__fn *)in_RSI,__child_stack_00,iVar9,in_R8);
    pOVar11 = (Object *)CONCAT44(extraout_var_00,iVar9);
LAB_00127de3:
    (this->TempResult).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar20] = pOVar11;
    this->Result = (this->TempResult).
                   super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20];
    break;
  case inc:
    in_RSI = (char *)(ulong)*(uint *)&pIVar12->field_0xc;
    pIVar17 = (InstructionData *)((DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555);
    if (pIVar17 < in_RSI || (long)pIVar17 - (long)in_RSI == 0) goto LAB_00127f38;
    lVar14 = **(long **)(DAT_001537f8 + 0x10 + (long)in_RSI * 0x18);
    lVar15 = (ulong)*(uint *)&pIVar12[1]._vptr_InstructionData * 0x20;
    if (*(int *)(lVar14 + lVar15) != 4) {
LAB_00127f46:
      __assert_fail("getFromIdentTable(ident_index).type == I_DyVarb",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/temp-getelement2.h"
                    ,0x24,"Object *ICM::getDyVarbData(const IdentIndex &)");
    }
    plVar4 = *(long **)(*(long *)(lVar14 + lVar15 + 0x18) + 8);
    *plVar4 = *plVar4 + 1;
    break;
  case jump:
    lVar20 = (long)pIVar12[1]._vptr_InstructionData;
    goto LAB_00127882;
  case jmpf:
  case jmpn:
    in_RSI = (char *)(pIVar12 + 1);
    pOVar11 = getObject(this,(Element *)in_RSI);
    if (pOVar11->type != 6) {
      printf("%s","Error Not Boolean");
      putchar(10);
      return (Object *)0x0;
    }
    if (((ppIVar3[lVar20]->Inst == jmpf & *pOVar11->data) != 0) ||
       (ppIVar3[lVar20]->Inst == jmpn && (*pOVar11->data & 1) == 0)) {
      lVar20 = (long)pIVar12[2]._vptr_InstructionData;
      goto LAB_00127882;
    }
    break;
  case jpsm:
  case jpse:
  case jpla:
  case jple:
    uVar19 = (ulong)*(uint *)&pIVar12->field_0xc;
    uVar16 = (DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555;
    if (uVar16 < uVar19 || uVar16 - uVar19 == 0) goto LAB_00127f38;
    lVar14 = **(long **)(DAT_001537f8 + 0x10 + uVar19 * 0x18);
    lVar15 = (ulong)*(uint *)&pIVar12[1]._vptr_InstructionData * 0x20;
    if (*(int *)(lVar14 + lVar15) != 4) goto LAB_00127f46;
    plVar4 = *(long **)(*(long *)(lVar14 + lVar15 + 0x18) + 8);
    in_RSI = (char *)((long)(pIVar12 + 1) + 8);
    pOVar11 = getObject(this,(Element *)in_RSI);
    if (3 < ppIVar3[lVar20]->Inst - jpsm) break;
    plVar5 = (long *)pOVar11->data;
    switch(ppIVar3[lVar20]->Inst) {
    case jpsm:
      if (*plVar5 <= *plVar4) break;
LAB_00127e4c:
      lVar20 = *(long *)((long)(pIVar12 + 2) + 8);
      goto LAB_00127882;
    case jpse:
      if (*plVar4 <= *plVar5) goto LAB_00127e4c;
      break;
    case jpla:
      if (*plVar5 < *plVar4) goto LAB_00127e4c;
      break;
    case jple:
      if (*plVar5 <= *plVar4) goto LAB_00127e4c;
    }
    break;
  default:
    if (IVar2 == rest) {
      pOVar11 = getObject(this,(Element *)((long)(pIVar12 + 1) + 8));
      in_RSI = (char *)(ulong)*(uint *)&pIVar12->field_0xc;
      pIVar17 = (InstructionData *)((DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555);
      if (pIVar17 < in_RSI || (long)pIVar17 - (long)in_RSI == 0) goto LAB_00127f38;
      lVar14 = **(long **)(DAT_001537f8 + 0x10 + (long)in_RSI * 0x18);
      lVar15 = (ulong)*(uint *)&pIVar12[1]._vptr_InstructionData * 0x20;
      if (*(int *)(lVar14 + lVar15) != 4) {
        __assert_fail("getFromIdentTable(ident_index).type == I_DyVarb",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/temp-getelement2.h"
                      ,0x2a,"void ICM::setDyVarbRestType(const IdentIndex &, TypeUnit)");
      }
      *(undefined8 *)(lVar14 + lVar15 + 0x10) = *pOVar11->data;
    }
  }
  lVar20 = lVar20 + 1;
  goto LAB_00127882;
switchD_001278aa_caseD_1:
  return this->Result;
}

Assistant:

Object* run() {
			size_t ProgramCounter = 0;
			std::srand(static_cast<unsigned>(std::time(0)));
			while (true) {
				using namespace Instruction;
				auto &Inst = InstList[ProgramCounter];
				//println(ProgramCounter, "| ", Inst->to_string());
				switch (Inst->inst()) {
				case ccal: {
					Insts::CheckCall &inst = static_cast<Insts::CheckCall&>(*Inst);
					TempResult[ProgramCounter] = CheckCall(inst.Data);
					Result = TempResult[ProgramCounter];
					break;
				}
						   /*case farg: {
						   Insts::FuncArgs &inst = static_cast<Insts::FuncArgs&>(*Inst);
						   Global.Func.Args = createDataList(inst.Args);
						   break;
						   }
						   case fargl: {
						   Insts::FuncArgsLight &inst = *static_cast<Insts::FuncArgsLight*>(Inst);
						   Global.Func.Args = inst.Args;
						   break;
						   }
						   case fargv: {
						   break;
						   }
						   case fsub: {
						   Insts::FuncSub &inst = static_cast<Insts::FuncSub&>(*Inst);
						   auto &args = Global.Func.Args;
						   auto &ftu = GlobalFunctionTable[inst.Func.index];
						   size_t id = getCallID(ftu, args);
						   if (id != ftu.size()) {
						   Global.Func.Func.index = inst.Func.index;
						   Global.Func.Func.subid = id;
						   }
						   else {
						   println("Error Unfind args match function ", ftu.getName(), ".");
						   Global.Func.Func.index = 0;
						   Global.Func.Func.subid = 0;
						   }
						   break;
						   }
						   case fsubr: {
						   break;
						   }
						   case fsubv: {
						   break;
						   }
						   case fcal: {
						   auto &args = Global.Func.Args;
						   auto &func = Global.Func.Func;
						   if (func.index == 0) {
						   println("Call Error");
						   return Result;
						   }
						   ObjectPtr &&op = GlobalFunctionTable[func.index][func.subid].call(args);
						   TempResult[ProgramCounter] = op.get();
						   Result = TempResult[ProgramCounter];
						   break;
						   }*/
				case let:
				case cpy:
				case ref: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					if (inst.Data.isLiteral()) {
						setDyVarbData(inst.VTU, createObjectFromLiteral(inst.Data, EP));
					}
					else if (inst.Data.isRefer()) {
						setDyVarbData(inst.VTU, TempResult[inst.Data.getRefer()]);
					}
					else if (inst.Data.isIdentType(I_DyVarb)) {
						switch (Inst->inst()) {
						case let:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data));
							break;
						case cpy:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data)->clone());
							break;
						case ref:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data)); // TODO
							break;
						}
					}
					else if (inst.Data.isIdent()) {
						setDyVarbData(inst.VTU, getIdentData(inst.Data));
					}
					else
						println("Error in Assign.");
					break;
				}
				case dim: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					break;
				}
				case rest: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					//(restrict a (type 5))
					Object *data = getObject(inst.Data);
					setDyVarbRestType(inst.VTU, data->dat<T_Type>().get());
					break;
				}
				case cpys: {
					Insts::CopySingle &inst = static_cast<Insts::CopySingle&>(*Inst);
					TempResult[ProgramCounter] = getObject(inst.Data)->clone(); // TODO
					Result = TempResult[ProgramCounter];
					break;
				}
				case stor: {
					Insts::Store &inst = static_cast<Insts::Store&>(*Inst);
					TempResult[ProgramCounter] = getObject(inst.Data); // TODO
					Result = TempResult[ProgramCounter];
					break;
				}
				case sing: {
					TempResult[ProgramCounter] = Result;
					Result = TempResult[ProgramCounter];
					break;
				}
				case jump: {
					Insts::Jump &inst = static_cast<Insts::Jump&>(*Inst);
					ProgramCounter = inst.Index;
					continue;
				}
				case jmpf:
				case jmpn: {
					Insts::JumpNot &inst = static_cast<Insts::JumpNot&>(*Inst);
					Object *op = getObject(inst.Data);
					if (op->isType(T_Boolean)) {
						bool r = op->dat<T_Boolean>();
						if ((Inst->inst() == jmpf && r) || (Inst->inst() == jmpn && !r)) {
							ProgramCounter = inst.Index;
							continue;
						}
					}
					else {
						println("Error Not Boolean");
						return nullptr;
					}
					break;
				}
				case inc: {
					Insts::Inc &inst = static_cast<Insts::Inc&>(*Inst);
					getDyVarbData(inst.VTU)->dat<T_Number>() += 1;
					break;
				}
				case jpsm:
				case jpse:
				case jpla:
				case jple: {
					Insts::JumpCompare &inst = static_cast<Insts::JumpCompare&>(*Inst);
					const auto &n1 = getDyVarbData(inst.VTU)->dat<T_Number>();
					const auto &n2 = getObject(inst.Data)->dat<T_Number>();
					bool r;
					switch (Inst->inst()) {
					case jpsm: r = n1 < n2; break;
					case jpse: r = n1 <= n2; break;
					case jpla: r = n1 > n2; break;
					case jple: r = n1 >= n2; break;
					default:   r = false;
					}
					if (r) {
						ProgramCounter = inst.Index;
						continue;
					}
					break;
				}
				case list: {
					Insts::List &inst = static_cast<Insts::List&>(*Inst);
					// TODO
					auto v = createDataList(inst.Data);
					lightlist_creater<Object*> llc(v.size());
					for (auto p : v) {
						llc.push_back(p->clone());
					}

					TempResult[ProgramCounter] = new Objects::List(TypeBase::ListType(llc.data()));
					Result = TempResult[ProgramCounter];
					break;
				}
				case pti: {
					Insts::PrintIdent &inst = static_cast<Insts::PrintIdent&>(*Inst);
					for (Element &e : inst.Args) {
						if (e.isIdentType(I_DyVarb))
							print(getIdentName(e), "(");
						Object *op = getObject(e);
						if (op)
							print(getObject(e)->to_string());
						else
							print("Null");
						if (e.isIdentType(I_DyVarb))
							print(")");
						println();
					}
					break;
				}
				case end: {
					return Result;
				}
				}
				ProgramCounter++;
			}
			return Result;
		}